

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<capnp::ParsedSchema> * __thiscall
capnp::ParsedSchema::findNested
          (Maybe<capnp::ParsedSchema> *__return_storage_ptr__,ParsedSchema *this,StringPtr name)

{
  Impl *pIVar1;
  char *pcVar2;
  StringPtr childName;
  anon_class_8_1_8991fb9c local_80;
  ParsedSchema *local_78;
  char *pcStack_70;
  Reader local_68;
  Maybe<kj::_::Mutex::Waiter_&> local_28;
  ParsedSchema *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (ParsedSchema *)name.content.ptr;
  local_28.ptr = (Waiter *)this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  pIVar1 = kj::Own<capnp::SchemaParser::Impl>::operator->(&this->parser->impl);
  Schema::getProto(&local_68,&this->super_Schema);
  pcVar2 = (char *)capnp::schema::Node::Reader::getId(&local_68);
  local_78 = this_local;
  pcStack_70 = name_local.content.ptr;
  childName.content.size_ = (size_t)this_local;
  childName.content.ptr = pcVar2;
  capnp::compiler::Compiler::lookup
            ((Compiler *)&stack0xffffffffffffffc8,(uint64_t)&pIVar1->compiler,childName);
  local_80.this = this;
  kj::Maybe<unsigned_long>::
  map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_parser_c__:318:7)>
            (__return_storage_ptr__,(Maybe<unsigned_long> *)&stack0xffffffffffffffc8,&local_80);
  kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<ParsedSchema> ParsedSchema::findNested(kj::StringPtr name) const {
  return parser->impl->compiler.lookup(getProto().getId(), name).map(
      [this](uint64_t childId) {
        return ParsedSchema(parser->impl->compiler.getLoader().get(childId), *parser);
      });
}